

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_all.cpp
# Opt level: O1

void __thiscall tst_helpers_all::atLeastOnePromiseReject_void(tst_helpers_all *this)

{
  QSharedData *pQVar1;
  long lVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar3;
  PromiseResolver<void> PVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar5;
  _func_int **pp_Var6;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar7;
  char cVar8;
  bool bVar9;
  QPromise<void> *data;
  PromiseDataBase<void,_void_()> *this_00;
  QObject *pQVar10;
  int *piVar11;
  QEvent *this_01;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  PromiseDataBase<void,_void_()> *this_02;
  ulong uVar15;
  long lVar16;
  QSharedData *pQVar17;
  char *pcVar18;
  QByteArrayView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_130;
  PromiseResolver<void> resolver;
  _Manager_type local_118;
  PromiseResolver<void> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e8;
  QPromise<void> local_e0;
  qsizetype local_d0;
  _Any_data local_c8;
  undefined **local_b8;
  PromiseDataBase<void,_void_()> *local_b0;
  undefined **local_a8;
  QPromise<void> p;
  QPromise<void> p1;
  QPromise<void> p0;
  QArrayData *local_68;
  storage_type_conflict *psStack_60;
  qsizetype local_58;
  QSharedData *local_48;
  _func_int **local_40;
  _func_int **local_38;
  
  QtPromise::resolve();
  QtPromise::resolve();
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  local_38 = (_func_int **)&PTR__PromiseDataBase_0012da00;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012da00;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  local_40 = (_func_int **)&PTR__PromiseDataBase_0012d988;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012d988;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_48 = &this_00->super_QSharedData;
  local_c8._M_unused._M_object = &PTR__QPromiseBase_0012d950;
  local_c8._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_c8);
  local_c8._M_unused._M_object = &PTR__QPromiseBase_0012d8f0;
  if ((PromiseDataBase<void,_void_()> *)local_c8._8_8_ != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar17 = (QSharedData *)(local_c8._8_8_ + 8);
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_c8._8_8_ != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (**(code **)(*(long *)local_c8._8_8_ + 8))();
    }
  }
  PVar4.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  pQVar10 = (QObject *)QThread::currentThread();
  if (pQVar10 == (QObject *)0x0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar10);
  }
  if (piVar11 != (int *)0x0) {
    if (((pQVar10 != (QObject *)0x0) && (piVar11[1] != 0)) &&
       (cVar8 = QThread::isFinished(), cVar8 == '\0')) {
      if (piVar11[1] == 0) {
        pQVar10 = (QObject *)(QThread *)0x0;
      }
      pQVar10 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar10);
      if ((pQVar10 != (QObject *)0x0) || (cVar8 = QCoreApplication::closingDown(), cVar8 == '\0')) {
        this_01 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(this_01,None);
        *(undefined ***)this_01 = &PTR__Event_0012d798;
        *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
         (this_01 + 0x10) = PVar4.m_d.d;
        if (PVar4.m_d.d != (Data *)0x0) {
          LOCK();
          *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
          UNLOCK();
        }
        QCoreApplication::postEvent(pQVar10,this_01,0);
      }
    }
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      operator_delete(piVar11);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar17 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8._M_unused._M_object = &PTR__QPromiseBase_0012d950;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_b8 = &PTR__QPromiseBase_0012d950;
  if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar17 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8 = &PTR__QPromiseBase_0012d950;
  local_b0 = this_00;
  lVar12 = QArrayData::allocate((QArrayData **)&resolver,0x10,8,3,KeepSize);
  local_118 = (_Manager_type)0x0;
  uVar15 = 0xfffffffffffffff0;
  do {
    lVar16 = (long)local_118 * 0x10;
    *(undefined ***)(lVar12 + lVar16) = &PTR__QPromiseBase_0012d8f0;
    lVar2 = *(long *)((long)&local_b0 + uVar15);
    *(long *)(lVar12 + 8 + lVar16) = lVar2;
    if (lVar2 != 0) {
      LOCK();
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      UNLOCK();
    }
    local_118 = local_118 + 1;
    *(undefined ***)(lVar16 + lVar12) = &PTR__QPromiseBase_0012d950;
    uVar15 = uVar15 + 0x10;
  } while (uVar15 < 0x20);
  QtPromise::all<QList>((QtPromise *)&p,(QList<QtPromise::QPromise<void>_> *)&resolver);
  QArrayDataPointer<QtPromise::QPromise<void>_>::~QArrayDataPointer
            ((QArrayDataPointer<QtPromise::QPromise<void>_> *)&resolver);
  lVar12 = 0x30;
  do {
    *(undefined ***)((long)&local_e0.super_QPromiseBase<void>.m_d.d + lVar12) =
         &PTR__QPromiseBase_0012d8f0;
    if (*(long *)((long)&local_d0 + lVar12) != 0) {
      LOCK();
      piVar11 = (int *)(*(long *)((long)&local_d0 + lVar12) + 8);
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if ((*piVar11 == 0) && (*(long **)((long)&local_d0 + lVar12) != (long *)0x0)) {
        (**(code **)(**(long **)((long)&local_d0 + lVar12) + 8))();
      }
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  bVar9 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  bVar9 = (bool)(~bVar9 & ((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>
                          ).m_error.m_data._M_exception_object == (void *)0x0);
  resolver.m_d.d._0_1_ = 1;
  local_c8._M_pod_data[0] = bVar9;
  pcVar13 = QTest::toString<bool>((bool *)local_c8._M_pod_data);
  pcVar14 = QTest::toString<bool>((bool *)&resolver);
  cVar8 = QTest::compare_helper
                    (bVar9,"Compared values are not the same",pcVar13,pcVar14,"p0.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                     ,0xae);
  if (cVar8 != '\0') {
    bVar9 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                      (&(p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    bVar9 = (bool)(~bVar9 & ((p1.super_QPromiseBase<void>.m_d.d)->
                            super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object
                            == (void *)0x0);
    resolver.m_d.d._0_1_ = 1;
    local_c8._M_pod_data[0] = bVar9;
    pcVar13 = QTest::toString<bool>((bool *)local_c8._M_pod_data);
    pcVar14 = QTest::toString<bool>((bool *)&resolver);
    cVar8 = QTest::compare_helper
                      (bVar9,"Compared values are not the same",pcVar13,pcVar14,"p1.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                       ,0xaf);
    if (cVar8 != '\0') {
      bVar9 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
      resolver.m_d.d._0_1_ = 1;
      local_c8._M_pod_data[0] = bVar9;
      pcVar13 = QTest::toString<bool>((bool *)local_c8._M_pod_data);
      pcVar14 = QTest::toString<bool>((bool *)&resolver);
      cVar8 = QTest::compare_helper
                        (bVar9,"Compared values are not the same",pcVar13,pcVar14,"p2.isPending()",
                         "true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                         ,0xb0);
      if (cVar8 != '\0') {
        bVar9 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                          (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>
                          );
        resolver.m_d.d._0_1_ = 1;
        local_c8._M_pod_data[0] = bVar9;
        pcVar13 = QTest::toString<bool>((bool *)local_c8._M_pod_data);
        pcVar14 = QTest::toString<bool>((bool *)&resolver);
        pcVar18 = "p.isPending()";
        cVar8 = QTest::compare_helper
                          (bVar9,"Compared values are not the same",pcVar13,pcVar14,"p.isPending()",
                           "true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                           ,0xb1);
        if (cVar8 != '\0') {
          local_68 = (QArrayData *)0x0;
          psStack_60 = (storage_type_conflict *)0x0;
          local_58 = 0;
          this_02 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
          this_02->_vptr_PromiseDataBase = (_func_int **)0x0;
          *(undefined8 *)&this_02->super_QSharedData = 0;
          (this_02->m_catchers).d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                *)0x0;
          (this_02->m_catchers).d.size = 0;
          (this_02->m_handlers).d.size = 0;
          (this_02->m_catchers).d.d = (Data *)0x0;
          (this_02->m_handlers).d.d = (Data *)0x0;
          (this_02->m_handlers).d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
          *(undefined8 *)&this_02->m_lock = 0;
          *(undefined8 *)&this_02->m_settled = 0;
          (this_02->m_error).m_data._M_exception_object = (void *)0x0;
          this_02->_vptr_PromiseDataBase = local_38;
          QReadWriteLock::QReadWriteLock(&this_02->m_lock,0);
          this_02->m_settled = false;
          (this_02->m_handlers).d.d = (Data *)0x0;
          (this_02->m_handlers).d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
          (this_02->m_handlers).d.size = 0;
          (this_02->m_catchers).d.d = (Data *)0x0;
          (this_02->m_catchers).d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                *)0x0;
          (this_02->m_catchers).d.size = 0;
          (this_02->m_error).m_data._M_exception_object = (void *)0x0;
          this_02->_vptr_PromiseDataBase = local_40;
          LOCK();
          (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i =
               (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          pQVar17 = &this_02->super_QSharedData;
          LOCK();
          (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i =
               (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          local_e0.super_QPromiseBase<void>._vptr_QPromiseBase =
               (_func_int **)&PTR__QPromiseBase_0012d950;
          local_e0.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this_02;
          QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,&local_e0);
          local_e0.super_QPromiseBase<void>._vptr_QPromiseBase =
               (_func_int **)&PTR__QPromiseBase_0012d8f0;
          if (&(local_e0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
              (PromiseDataBase<void,_void_()> *)0x0) {
            LOCK();
            pQVar1 = &((local_e0.super_QPromiseBase<void>.m_d.d)->
                      super_PromiseDataBase<void,_void_()>).super_QSharedData;
            (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i == 0) &&
               (&(local_e0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
                (PromiseDataBase<void,_void_()> *)0x0)) {
              (*((local_e0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                _vptr_PromiseDataBase[1])();
            }
          }
          QVar7.d = p.super_QPromiseBase<void>.m_d.d;
          if (resolver_1.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
            UNLOCK();
          }
          local_130 = resolver_1.m_d.d;
          if (resolver_1.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
            UNLOCK();
          }
          local_e8 = resolver_1.m_d.d;
          QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
          create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
                    ((function<void_(const_int_&)> *)&local_c8,
                     (PromiseHandler<void,decltype(nullptr),void> *)0x0,&local_130,
                     (QPromiseResolve<void> *)&local_e8,(QPromiseReject<void> *)pcVar18);
          QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
                    (&(QVar7.d)->super_PromiseDataBase<void,_void_()>,
                     (function<void_(const_int_&)> *)&local_c8);
          if (local_b8 != (undefined **)0x0) {
            (*(code *)local_b8)(&local_c8,&local_c8,__destroy_functor);
          }
          QVar5.d = local_e8.d;
          QVar3.d = local_130.d;
          if (local_130.d != (Data *)0x0) {
            LOCK();
            ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (local_e8.d != (Data *)0x0) {
            LOCK();
            *(int *)&((QPromiseBase<void> *)&(local_e8.d)->super_QSharedData)->_vptr_QPromiseBase =
                 *(int *)&((QPromiseBase<void> *)&(local_e8.d)->super_QSharedData)->
                          _vptr_QPromiseBase + 1;
            UNLOCK();
          }
          resolver.m_d.d =
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
               (Data *)0x0;
          resolver.m_d.d =
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
               operator_new(0x18);
          *(Data **)resolver.m_d.d = QVar3.d;
          if (QVar3.d != (Data *)0x0) {
            LOCK();
            ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          ((Data *)resolver.m_d.d)->promise = (QPromise<void> *)QVar5.d;
          if (QVar5.d == (Data *)0x0) {
            *(QArrayData ***)((long)resolver.m_d.d + 0x10) = &local_68;
          }
          else {
            LOCK();
            *(int *)&((QPromiseBase<void> *)&(QVar5.d)->super_QSharedData)->_vptr_QPromiseBase =
                 *(int *)&((QPromiseBase<void> *)&(QVar5.d)->super_QSharedData)->_vptr_QPromiseBase
                 + 1;
            UNLOCK();
            *(QArrayData ***)((long)resolver.m_d.d + 0x10) = &local_68;
            LOCK();
            *(int *)&((QPromiseBase<void> *)&(QVar5.d)->super_QSharedData)->_vptr_QPromiseBase =
                 *(int *)&((QPromiseBase<void> *)&(QVar5.d)->super_QSharedData)->_vptr_QPromiseBase
                 + -1;
            UNLOCK();
            if (*(int *)&((QPromiseBase<void> *)&(QVar5.d)->super_QSharedData)->_vptr_QPromiseBase
                == 0) {
              operator_delete(QVar5.d,0x10);
            }
          }
          if (QVar3.d != (Data *)0x0) {
            LOCK();
            ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
              operator_delete(QVar3.d,0x10);
            }
          }
          QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
                    (&(QVar7.d)->super_PromiseDataBase<void,_void_()>,
                     (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
          std::
          _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
          ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
          if (local_e8.d != (Data *)0x0) {
            LOCK();
            *(int *)&((QPromiseBase<void> *)&(local_e8.d)->super_QSharedData)->_vptr_QPromiseBase =
                 *(int *)&((QPromiseBase<void> *)&(local_e8.d)->super_QSharedData)->
                          _vptr_QPromiseBase + -1;
            UNLOCK();
            if ((*(int *)&((QPromiseBase<void> *)&(local_e8.d)->super_QSharedData)->
                          _vptr_QPromiseBase == 0) && (local_e8.d != (Data *)0x0)) {
              operator_delete(local_e8.d,0x10);
            }
          }
          if (local_130.d != (Data *)0x0) {
            LOCK();
            ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
               (local_130.d != (Data *)0x0)) {
              operator_delete(local_130.d,0x10);
            }
          }
          if (resolver_1.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
            UNLOCK();
            if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
              operator_delete((void *)resolver_1.m_d.d,0x10);
            }
          }
          QVar7.d = p.super_QPromiseBase<void>.m_d.d;
          bVar9 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                            (&(p.super_QPromiseBase<void>.m_d.d)->
                              super_PromiseDataBase<void,_void_()>);
          if (!bVar9) {
            QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
                      (&(QVar7.d)->super_PromiseDataBase<void,_void_()>);
          }
          bVar9 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
          while (bVar9 != false) {
            QCoreApplication::processEvents();
            QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
            bVar9 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
          }
          LOCK();
          (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i == 0) {
            (*this_02->_vptr_PromiseDataBase[1])(this_02);
          }
          LOCK();
          (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i == 0) {
            (*this_02->_vptr_PromiseDataBase[1])(this_02);
          }
          QVar19.m_data = (storage_type *)0x3;
          QVar19.m_size = (qsizetype)&local_e0;
          QString::fromUtf8(QVar19);
          pp_Var6 = local_e0.super_QPromiseBase<void>._vptr_QPromiseBase;
          QVar20.m_data = psStack_60;
          QVar20.m_size = local_58;
          QVar21.m_data = (storage_type_conflict *)local_e0.super_QPromiseBase<void>.m_d.d;
          QVar21.m_size = local_d0;
          cVar8 = QTest::qCompare(QVar20,QVar21,"waitForError(p, QString{})","QString{\"foo\"}",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                                  ,0xb2);
          if ((QArrayData *)pp_Var6 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)pp_Var6)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)pp_Var6)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)pp_Var6)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)pp_Var6,2,8);
            }
          }
          if (local_68 != (QArrayData *)0x0) {
            LOCK();
            (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_68,2,8);
            }
          }
          if (cVar8 != '\0') {
            bVar9 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
            bVar9 = (bool)(~bVar9 & (this_00->m_error).m_data._M_exception_object != (void *)0x0);
            local_e0.super_QPromiseBase<void>._vptr_QPromiseBase =
                 (_func_int **)
                 CONCAT71(local_e0.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,bVar9);
            local_68 = (QArrayData *)CONCAT71(local_68._1_7_,1);
            pcVar13 = QTest::toString<bool>((bool *)&local_e0);
            pcVar14 = QTest::toString<bool>((bool *)&local_68);
            QTest::compare_helper
                      (bVar9,"Compared values are not the same",pcVar13,pcVar14,"p2.isRejected()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                       ,0xb3);
          }
        }
      }
    }
  }
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d8f0;
  if (p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar17 = &((p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  LOCK();
  (local_48->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_48->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_48->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])();
  }
  if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar17 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar17 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_helpers_all::atLeastOnePromiseReject_void()
{
    auto p0 = QtPromise::resolve();
    auto p1 = QtPromise::resolve();
    auto p2 = QtPromise::QPromise<void>{
        [](const QtPromise::QPromiseResolve<void>&, const QtPromise::QPromiseReject<void>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    auto p = QtPromise::all(QVector<QtPromise::QPromise<void>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p2.isRejected(), true);
}